

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O2

ptrdiff_t rcnb_decode_blockend(char *plaintext_out,rcnb_decodestate *state_in)

{
  _Bool _Var1;
  ptrdiff_t pVar2;
  char *plaintext_char;
  
  if ((state_in->i & 0xfffffffffffffffd) == 0) {
    plaintext_char = plaintext_out;
    if ((state_in->i != 2) ||
       (_Var1 = rcnb_decode_byte(state_in->trailing_code,&plaintext_char), _Var1)) {
      *plaintext_char = '\0';
      state_in->i = 0;
      pVar2 = (long)plaintext_char - (long)plaintext_out;
    }
    else {
      pVar2 = -1;
    }
    return pVar2;
  }
  return -1;
}

Assistant:

ptrdiff_t rcnb_decode_blockend(char* const plaintext_out, rcnb_decodestate* state_in)
{
    if (state_in->i != 0 && state_in->i != 2)
        return -1;
    char* plaintext_char = plaintext_out;
    if (state_in->i == 2) {
        if(!rcnb_decode_byte(state_in->trailing_code, &plaintext_char))
            return -1;
    }
    *plaintext_char = 0;
    state_in->i = 0;
    return plaintext_char - plaintext_out;
}